

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O2

void __thiscall
QPDFPageObjectHelper::copyAnnotations
          (QPDFPageObjectHelper *this,QPDFPageObjectHelper *from_page,QPDFMatrix *cm,
          QPDFAcroFormDocumentHelper *afdh,QPDFAcroFormDocumentHelper *from_afdh)

{
  pointer pQVar1;
  bool bVar2;
  QPDF *this_00;
  QPDF *pQVar3;
  unsigned_long_long uVar4;
  unsigned_long_long uVar5;
  logic_error *this_01;
  QPDFObjectHandle *annot;
  pointer item;
  BaseHandle *pBVar6;
  element_type *from_afdh_00;
  allocator<char> local_159;
  string local_158;
  undefined1 local_138 [16];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_annots;
  QPDFObjectHandle annots;
  set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> old_fields;
  undefined1 local_c8 [16];
  QPDFObjectHandle old_annots;
  shared_ptr<QPDFAcroFormDocumentHelper> from_afdhph;
  shared_ptr<QPDFAcroFormDocumentHelper> afdhph;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_fields;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_58;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_48;
  
  pBVar6 = &(from_page->super_QPDFObjectHelper).super_BaseHandle;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_158,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&old_fields,"/Annots",(allocator<char> *)&new_annots);
  QPDFObjectHandle::getKey(&old_annots,&local_158);
  std::__cxx11::string::~string((string *)&old_fields);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_158._M_string_length);
  bVar2 = QPDFObjectHandle::isArray(&old_annots);
  if (bVar2) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_158,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar6);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&old_fields,
               "QPDFPageObjectHelper::copyAnnotations: from page is a direct object",
               (allocator<char> *)&new_annots);
    this_00 = QPDFObjectHandle::getQPDF((QPDFObjectHandle *)&local_158,(string *)&old_fields);
    std::__cxx11::string::~string((string *)&old_fields);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_158._M_string_length);
    pBVar6 = &(this->super_QPDFObjectHelper).super_BaseHandle;
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_158,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar6);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&old_fields,
               "QPDFPageObjectHelper::copyAnnotations: this page is a direct object",
               (allocator<char> *)&new_annots);
    pQVar3 = QPDFObjectHandle::getQPDF((QPDFObjectHandle *)&local_158,(string *)&old_fields);
    std::__cxx11::string::~string((string *)&old_fields);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_158._M_string_length);
    new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &old_fields._M_t._M_impl.super__Rb_tree_header._M_header;
    old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    old_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    afdhph.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    afdhph.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    from_afdhph.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    from_afdhph.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (afdh == (QPDFAcroFormDocumentHelper *)0x0) {
      std::make_shared<QPDFAcroFormDocumentHelper,QPDF&>((QPDF *)&local_158);
      std::__shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&afdhph.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2> *)&local_158)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_158._M_string_length);
      afdh = afdhph.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    }
    from_afdh_00 = afdh;
    if (pQVar3 != this_00) {
      if (from_afdh == (QPDFAcroFormDocumentHelper *)0x0) {
        std::make_shared<QPDFAcroFormDocumentHelper,QPDF&>((QPDF *)&local_158);
        std::__shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&from_afdhph.
                    super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2> *)
                   &local_158);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_158._M_string_length);
        from_afdh_00 = from_afdhph.
                       super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
      }
      else {
        uVar4 = QPDF::getUniqueId((from_afdh->super_QPDFDocumentHelper).qpdf);
        uVar5 = QPDF::getUniqueId(this_00);
        from_afdh_00 = from_afdh;
        if (uVar4 != uVar5) {
          this_01 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error
                    (this_01,
                     "QPDFAcroFormDocumentHelper::copyAnnotations: from_afdh is not from the same QPDF as from_page"
                    );
          __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
      }
    }
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&old_annots);
    QPDFAcroFormDocumentHelper::transformAnnotations
              (afdh,(QPDFObjectHandle *)&local_58,&new_annots,&new_fields,&old_fields,cm,this_00,
               from_afdh_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&local_48,&new_fields);
    QPDFAcroFormDocumentHelper::addAndRenameFormFields(afdh,&local_48);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_48);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_138,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar6);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"/Annots",(allocator<char> *)local_c8);
    QPDFObjectHandle::getKey(&annots,(string *)local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8));
    bVar2 = QPDFObjectHandle::isArray(&annots);
    if (!bVar2) {
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_c8,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar6);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"/Annots",&local_159);
      QPDFObjectHandle::newArray();
      QPDFObjectHandle::replaceKeyAndGetNew
                ((QPDFObjectHandle *)local_138,(string *)local_c8,(QPDFObjectHandle *)&local_158);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&annots,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_138);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
      std::__cxx11::string::~string((string *)&local_158);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
    }
    pQVar1 = new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (item = new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_start; item != pQVar1; item = item + 1) {
      QPDFObjectHandle::appendItem(&annots,item);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&annots.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&from_afdhph.
                super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&afdhph.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::
    _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
    ::~_Rb_tree(&old_fields._M_t);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&new_fields);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&new_annots);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&old_annots.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
QPDFPageObjectHelper::copyAnnotations(
    QPDFPageObjectHelper from_page,
    QPDFMatrix const& cm,
    QPDFAcroFormDocumentHelper* afdh,
    QPDFAcroFormDocumentHelper* from_afdh)
{
    auto old_annots = from_page.getObjectHandle().getKey("/Annots");
    if (!old_annots.isArray()) {
        return;
    }

    QPDF& from_qpdf = from_page.getObjectHandle().getQPDF(
        "QPDFPageObjectHelper::copyAnnotations: from page is a direct object");
    QPDF& this_qpdf =
        oh().getQPDF("QPDFPageObjectHelper::copyAnnotations: this page is a direct object");

    std::vector<QPDFObjectHandle> new_annots;
    std::vector<QPDFObjectHandle> new_fields;
    std::set<QPDFObjGen> old_fields;
    std::shared_ptr<QPDFAcroFormDocumentHelper> afdhph;
    std::shared_ptr<QPDFAcroFormDocumentHelper> from_afdhph;
    if (!afdh) {
        afdhph = std::make_shared<QPDFAcroFormDocumentHelper>(this_qpdf);
        afdh = afdhph.get();
    }
    if (&this_qpdf == &from_qpdf) {
        from_afdh = afdh;
    } else if (from_afdh) {
        if (from_afdh->getQPDF().getUniqueId() != from_qpdf.getUniqueId()) {
            throw std::logic_error(
                "QPDFAcroFormDocumentHelper::copyAnnotations: from_afdh"
                " is not from the same QPDF as from_page");
        }
    } else {
        from_afdhph = std::make_shared<QPDFAcroFormDocumentHelper>(from_qpdf);
        from_afdh = from_afdhph.get();
    }

    afdh->transformAnnotations(
        old_annots, new_annots, new_fields, old_fields, cm, &from_qpdf, from_afdh);
    afdh->addAndRenameFormFields(new_fields);
    auto annots = oh().getKey("/Annots");
    if (!annots.isArray()) {
        annots = oh().replaceKeyAndGetNew("/Annots", QPDFObjectHandle::newArray());
    }
    for (auto const& annot: new_annots) {
        annots.appendItem(annot);
    }
}